

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O3

int __thiscall network::del_object(network *this,iobject *object)

{
  pair<std::_Rb_tree_iterator<std::pair<const_int,_iobject_*>_>,_std::_Rb_tree_iterator<std::pair<const_int,_iobject_*>_>_>
  pVar1;
  key_type local_14;
  
  if (object->netid_ != 0) {
    pVar1 = std::
            _Rb_tree<int,_std::pair<const_int,_iobject_*>,_std::_Select1st<std::pair<const_int,_iobject_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_iobject_*>_>_>
            ::equal_range(&(this->objects_)._M_t,&local_14);
    std::
    _Rb_tree<int,_std::pair<const_int,_iobject_*>,_std::_Select1st<std::pair<const_int,_iobject_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_iobject_*>_>_>
    ::_M_erase_aux(&(this->objects_)._M_t,(_Base_ptr)pVar1.first._M_node,
                   (_Base_ptr)pVar1.second._M_node);
    (*object->_vptr_iobject[1])(object);
    return 0;
  }
  __assert_fail("object->get_netid() != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jinjiazhang[P]protonet/protonet/network.cpp"
                ,0x84,"int network::del_object(iobject *)");
}

Assistant:

network::~network()
{

}